

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kratos_context.cc
# Opt level: O3

void init_context(module *m)

{
  PyObject *pPVar1;
  char *pcVar2;
  class_<kratos::Context> *pcVar3;
  code *local_1a8;
  undefined8 local_1a0;
  code *local_198;
  undefined8 local_190;
  code *local_188;
  undefined8 local_180;
  arg local_178;
  code *local_168;
  undefined8 local_160;
  arg local_158;
  code *local_148;
  undefined8 local_140;
  code *local_138;
  undefined8 local_130;
  arg local_128;
  arg local_118;
  code *local_108;
  undefined8 local_100;
  arg local_f8;
  code *local_e8;
  undefined8 local_e0;
  arg local_d8;
  code *local_c8;
  undefined8 local_c0;
  code *local_b8;
  undefined8 local_b0;
  code *local_a8;
  undefined8 local_a0;
  code *local_98;
  undefined8 local_90;
  code *local_88;
  undefined8 local_80;
  arg local_78;
  unique_function_record local_68;
  undefined8 local_60;
  arg local_58;
  undefined1 local_48 [8];
  cpp_function cf;
  class_<kratos::Context> local_38;
  class_<kratos::Context> context;
  
  pybind11::class_<kratos::Context>::class_<>
            (&local_38,(m->super_object).super_handle.m_ptr,"Context");
  pybind11::class_<kratos::Context>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_Kuree[P]kratos_extern_pybind11_include_pybind11_detail_init_h:177:28),_pybind11::detail::is_new_style_constructor>
            (&local_38,"__init__",(type *)&local_98,(is_new_style_constructor *)&local_88);
  local_98 = kratos::Context::generator;
  local_90 = 0;
  context.super_generic_type.super_object.super_handle.m_ptr._4_1_ = 5;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<kratos::Generator&(kratos::Context::*)(std::__cxx11::string_const&),pybind11::return_value_policy>
                     (&local_38,"generator",(offset_in_Var_to_subr *)&local_98,
                      (return_value_policy *)
                      ((long)&context.super_generic_type.super_object.super_handle.m_ptr + 4));
  local_88 = kratos::Context::empty_generator;
  local_80 = 0;
  context.super_generic_type.super_object.super_handle.m_ptr._5_1_ = 5;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<kratos::Generator&(kratos::Context::*)(),pybind11::return_value_policy>
                     (pcVar3,"empty_generator",(offset_in_Var_to_subr *)&local_88,
                      (return_value_policy *)
                      ((long)&context.super_generic_type.super_object.super_handle.m_ptr + 5));
  local_1a8 = kratos::Context::testbench;
  local_1a0 = 0;
  context.super_generic_type.super_object.super_handle.m_ptr._6_1_ = 5;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<kratos::TestBench&(kratos::Context::*)(std::__cxx11::string_const&),pybind11::return_value_policy>
                     (pcVar3,"testbench",(offset_in_Var_to_subr *)&local_1a8,
                      (return_value_policy *)
                      ((long)&context.super_generic_type.super_object.super_handle.m_ptr + 6));
  local_198 = kratos::Context::clear;
  local_190 = 0;
  pcVar3 = pybind11::class_<kratos::Context>::def<void(kratos::Context::*)()>
                     (pcVar3,"clear",(offset_in_Var_to_subr *)&local_198);
  local_188 = kratos::Context::get_hash;
  local_180 = 0;
  local_178.name = "internal_generator";
  local_178._8_1_ = local_178._8_1_ & 0xfc | 2;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<unsigned_long(kratos::Context::*)(kratos::Generator_const*)const,pybind11::arg>
                     (pcVar3,"get_hash",(offset_in_Var_to_subr *)&local_188,&local_178);
  local_168 = kratos::Context::get_generators_by_name;
  local_160 = 0;
  local_158.name = "name";
  local_158._8_1_ = local_158._8_1_ & 0xfc | 2;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<std::set<std::shared_ptr<kratos::Generator>,std::less<std::shared_ptr<kratos::Generator>>,std::allocator<std::shared_ptr<kratos::Generator>>>(kratos::Context::*)(std::__cxx11::string_const&)const,pybind11::arg>
                     (pcVar3,"get_generators_by_name",(offset_in_Var_to_subr *)&local_168,&local_158
                     );
  local_148 = kratos::Context::hash_table_size;
  local_140 = 0;
  pcVar3 = pybind11::class_<kratos::Context>::def<unsigned_long(kratos::Context::*)()const>
                     (pcVar3,"hash_table_size",(offset_in_Var_to_subr *)&local_148);
  local_138 = kratos::Context::change_generator_name;
  local_130 = 0;
  local_128.name = "internal_generator";
  local_128._8_1_ = local_128._8_1_ & 0xfc | 2;
  local_118.name = "new_name";
  local_118._8_1_ = local_118._8_1_ & 0xfc | 2;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<void(kratos::Context::*)(kratos::Generator*,std::__cxx11::string_const&),pybind11::arg,pybind11::arg>
                     (pcVar3,"change_generator_name",(offset_in_Var_to_subr *)&local_138,&local_128,
                      &local_118);
  local_108 = kratos::Context::add;
  local_100 = 0;
  local_f8.name = "internal_generator";
  local_f8._8_1_ = local_f8._8_1_ & 0xfc | 2;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<void(kratos::Context::*)(kratos::Generator*),pybind11::arg>
                     (pcVar3,"add",(offset_in_Var_to_subr *)&local_108,&local_f8);
  local_e8 = kratos::Context::has_hash;
  local_e0 = 0;
  local_d8.name = "internal_generator";
  local_d8._8_1_ = local_d8._8_1_ & 0xfc | 2;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<bool(kratos::Context::*)(kratos::Generator_const*)const,pybind11::arg>
                     (pcVar3,"has_hash",(offset_in_Var_to_subr *)&local_e8,&local_d8);
  pPVar1 = (pcVar3->super_generic_type).super_object.super_handle.m_ptr;
  local_78.name = &_Py_NoneStruct;
  __Py_NoneStruct = __Py_NoneStruct + 1;
  local_58.name = (char *)PyObject_GetAttrString(pPVar1,"clear_hash");
  if ((PyObject *)local_58.name == (PyObject *)0x0) {
    PyErr_Clear();
    local_58.name = &_Py_NoneStruct;
    __Py_NoneStruct = __Py_NoneStruct + 1;
  }
  pcVar2 = local_58.name;
  local_48 = (undefined1  [8])0x0;
  pybind11::cpp_function::make_function_record((cpp_function *)&local_68);
  *(code **)((long)local_68._M_t.
                   super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                   .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
            0x30) =
       pybind11::cpp_function::
       initialize<init_context(pybind11::module_&)::$_0,void,kratos::Context&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_context(pybind11::module_&)::$_0&&,void(*)(kratos::Context&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
       ::{lambda(pybind11::detail::function_call&)#1}::function_call__;
  *(char **)local_68._M_t.
            super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            ._M_t.
            super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
            .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       "clear_hash";
  *(byte *)((long)local_68._M_t.
                  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  ._M_t.
                  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl +
           0x59) =
       *(byte *)((long)local_68._M_t.
                       super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       ._M_t.
                       super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
                       .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>.
                       _M_head_impl + 0x59) | 0x10;
  ((handle *)
  ((long)local_68._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x70))->
  m_ptr = pPVar1;
  ((handle *)
  ((long)local_68._M_t.
         super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         ._M_t.
         super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
         .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl + 0x78))->
  m_ptr = (PyObject *)pcVar2;
  pybind11::cpp_function::initialize_generic
            ((cpp_function *)local_48,&local_68,"({%}) -> None",
             (type_info **)
             pybind11::cpp_function::
             initialize<init_context(pybind11::module_&)::$_0,void,kratos::Context&,pybind11::name,pybind11::is_method,pybind11::sibling>(init_context(pybind11::module_&)::$_0&&,void(*)(kratos::Context&),pybind11::name_const&,pybind11::is_method_const&,pybind11::sibling_const&)
             ::types,1);
  std::
  unique_ptr<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ::~unique_ptr(&local_68);
  pybind11::object::~object((object *)&local_58);
  pybind11::object::~object((object *)&local_78);
  pybind11::detail::add_class_method((object *)pcVar3,"clear_hash",(cpp_function *)local_48);
  pybind11::object::~object((object *)local_48);
  local_68._M_t.
  super___uniq_ptr_impl<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  ._M_t.
  super__Tuple_impl<0UL,_pybind11::detail::function_record_*,_pybind11::cpp_function::InitializingFunctionRecordDeleter>
  .super__Head_base<0UL,_pybind11::detail::function_record_*,_false>._M_head_impl =
       (__uniq_ptr_data<pybind11::detail::function_record,_pybind11::cpp_function::InitializingFunctionRecordDeleter,_true,_true>
        )kratos::Context::enum_;
  local_60 = 0;
  local_48 = (undefined1  [8])0x406994;
  cf.super_function.super_object.super_handle.m_ptr._0_1_ = 2;
  local_58.name = "definition";
  local_58._8_1_ = 2;
  local_78.name = "width";
  local_78._8_1_ = 2;
  context.super_generic_type.super_object.super_handle.m_ptr._7_1_ = 5;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<kratos::Enum&(kratos::Context::*)(std::__cxx11::string_const&,std::map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>const&,unsigned_int),pybind11::arg,pybind11::arg,pybind11::arg,pybind11::return_value_policy>
                     (pcVar3,"enum",(offset_in_Var_to_subr *)&local_68,(arg *)local_48,&local_58,
                      &local_78,
                      (return_value_policy *)
                      ((long)&context.super_generic_type.super_object.super_handle.m_ptr + 7));
  local_c8 = kratos::Context::has_enum;
  local_c0 = 0;
  pcVar3 = pybind11::class_<kratos::Context>::
           def<bool(kratos::Context::*)(std::__cxx11::string_const&)const>
                     (pcVar3,"has_enum",(offset_in_Var_to_subr *)&local_c8);
  local_b8 = kratos::Context::track_generated;
  local_b0 = 0;
  local_a8 = kratos::Context::set_track_generated;
  local_a0 = 0;
  pybind11::class_<kratos::Context>::
  def_property<bool(kratos::Context::*)()const,void(kratos::Context::*)(bool)>
            (pcVar3,"track_generated",(offset_in_Var_to_subr *)&local_b8,
             (offset_in_Var_to_subr *)&local_a8);
  pybind11::object::~object((object *)&local_38);
  return;
}

Assistant:

void init_context(py::module &m) {
    using namespace kratos;
    auto context = py::class_<Context>(m, "Context");
    context.def(py::init())
        .def("generator", &Context::generator, py::return_value_policy::reference)
        .def("empty_generator", &Context::empty_generator, py::return_value_policy::reference)
        .def("testbench", &Context::testbench, py::return_value_policy::reference)
        .def("clear", &Context::clear)
        .def("get_hash", &Context::get_hash, py::arg("internal_generator"))
        .def("get_generators_by_name", &Context::get_generators_by_name, py::arg("name"))
        .def("hash_table_size", &Context::hash_table_size)
        .def("change_generator_name", &Context::change_generator_name,
             py::arg("internal_generator"), py::arg("new_name"))
        .def("add", &Context::add, py::arg("internal_generator"))
        .def("has_hash", &Context::has_hash, py::arg("internal_generator"))
        .def("clear_hash",
             [](Context &context) {
               // the original one gives segfault for g++-8. don't know why
               context.clear_hash();
             })
        .def("enum", &Context::enum_, py::arg("enum_name"), py::arg("definition"),
             py::arg("width"), py::return_value_policy::reference)
        .def("has_enum", &Context::has_enum)
        .def_property("track_generated", &Context::track_generated, &Context::set_track_generated);
}